

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.hh
# Opt level: O1

bool tchecker::operator!=(clock_constraint_t *c1,clock_constraint_t *c2)

{
  bool bVar1;
  
  bVar1 = true;
  if (((c1->_id1 == c2->_id1) && (c1->_id2 == c2->_id2)) && (c1->_cmp == c2->_cmp)) {
    bVar1 = c1->_value != c2->_value;
  }
  return bVar1;
}

Assistant:

inline constexpr tchecker::clock_id_t id1() const { return _id1; }